

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_dry_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  size_t i_00;
  uint *puVar1;
  pointer piVar2;
  ring_buffer<int> *prVar3;
  llama_token_data_array *plVar4;
  uint uVar5;
  int iVar6;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it_1;
  int *piVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> _Var10;
  uint *puVar11;
  size_t sVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> _Var16
  ;
  __node_type *p_Var17;
  ulong uVar18;
  ulong i_01;
  int iVar19;
  size_t i;
  ulong uVar20;
  float fVar21;
  double dVar22;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  pVar23;
  llama_token token;
  ring_buffer<int> *local_98;
  size_t local_90;
  ulong local_88;
  uint *local_80;
  size_t local_78;
  ulong local_70;
  ulong local_68;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> local_60
  ;
  vector<int,_std::allocator<int>_> *local_58;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  size_type local_48;
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *local_40;
  llama_token_data_array *local_38;
  
  puVar1 = (uint *)smpl->ctx;
  if (((((float)puVar1[1] != 0.0) || (NAN((float)puVar1[1]))) &&
      (1.0 < (float)puVar1[2] || (float)puVar1[2] == 1.0)) && (uVar5 = puVar1[4], uVar5 != 0)) {
    puVar11 = puVar1;
    if (uVar5 != 0xffffffff) {
      token = 0;
      puVar11 = puVar1 + 4;
      if ((int)uVar5 < 0) {
        puVar11 = (uint *)&token;
      }
    }
    uVar5 = puVar1[0x2a];
    if ((int)*puVar11 < (int)puVar1[0x2a]) {
      uVar5 = *puVar11;
    }
    if ((int)*puVar1 < (int)uVar5) {
      uVar5 = *puVar1;
    }
    if ((int)puVar1[3] < (int)uVar5) {
      local_98 = (ring_buffer<int> *)(puVar1 + 0x28);
      local_58 = (vector<int,_std::allocator<int>_> *)(puVar1 + 0x14);
      local_48 = (size_type)(int)uVar5;
      token = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign(local_58,local_48,&token);
      local_50 = (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(puVar1 + 0x1a);
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_50);
      local_40 = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                  *)(puVar1 + 6);
      local_88 = 0;
      if (0 < (int)uVar5) {
        local_88 = (ulong)uVar5;
      }
      local_90 = 0xffffffffffffffff;
      local_80 = puVar1;
      local_68 = (ulong)uVar5;
      local_38 = cur_p;
      for (sVar12 = 0; sVar12 != local_88; sVar12 = sVar12 + 1) {
        piVar7 = ring_buffer<int>::rat(local_98,sVar12);
        token = *piVar7;
        pVar23 = std::
                 _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(local_40,&token);
        if (pVar23.first.
            super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
            != (__node_type *)0x0) {
          uVar18 = 0xffffffffffffffff;
          local_78 = sVar12;
          local_60 = pVar23.second.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
          ;
          while( true ) {
            _Var10._M_cur =
                 (__node_type *)
                 pVar23.second.
                 super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                 ._M_cur;
            _Var16 = pVar23.first.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                     ._M_cur;
            iVar19 = (int)uVar18;
            if (_Var16.
                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_cur ==
                (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                 )_Var10._M_cur) break;
            uVar14 = (ulong)(*(long *)((long)_Var16.
                                             super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                             ._M_cur + 0x18) -
                            *(long *)((long)_Var16.
                                            super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                            ._M_cur + 0x10)) >> 2;
            iVar13 = (int)uVar14;
            if ((iVar19 < iVar13) && ((long)iVar13 <= (long)sVar12)) {
              local_70 = CONCAT44(local_70._4_4_,iVar19);
              uVar18 = 0;
              if (0 < iVar13) {
                uVar18 = uVar14 & 0xffffffff;
              }
              uVar20 = 0;
              sVar12 = local_90;
              do {
                if (uVar18 == uVar20) {
                  uVar18 = uVar14 & 0xffffffff;
                  _Var10._M_cur = local_60._M_cur;
                  sVar12 = local_78;
                  goto LAB_0024961b;
                }
                iVar19 = *(int *)(*(long *)((long)_Var16.
                                                  super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                  ._M_cur + 0x10) + uVar20 * 4);
                piVar7 = ring_buffer<int>::rat(local_98,sVar12);
                uVar20 = uVar20 + 1;
                sVar12 = sVar12 - 1;
              } while (iVar19 == *piVar7);
              uVar18 = local_70 & 0xffffffff;
              _Var10._M_cur = local_60._M_cur;
              sVar12 = local_78;
            }
LAB_0024961b:
            pVar23.second.
            super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                       )(_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                         )_Var10._M_cur;
            pVar23.first.
            super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                       )(__node_type *)
                        *(_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                          *)_Var16.
                            super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                            ._M_cur;
          }
          if (-1 < iVar19) {
            uVar18 = (ulong)(uint)((int)sVar12 - iVar19);
            goto LAB_00249647;
          }
        }
        local_90 = local_90 + 1;
      }
      uVar18 = local_68 & 0xffffffff;
LAB_00249647:
      if ((int)local_80[3] <= (int)uVar18) {
        uVar5 = (int)local_68 - 1;
        local_88 = (ulong)uVar5;
        local_90 = (size_t)(int)uVar5;
        local_70 = 0;
        p_Var17 = (__node_type *)0x1;
        uVar15 = 0;
        uVar20 = 0;
        uVar14 = local_68;
        local_78 = uVar18;
        while( true ) {
          plVar4 = local_38;
          if ((long)local_48 <= (long)p_Var17) break;
          iVar19 = (int)uVar20;
          i_01 = (ulong)iVar19;
          iVar13 = (int)p_Var17;
          if ((long)i_01 < (long)p_Var17) {
            local_60._M_cur._0_4_ = (int)uVar15;
            sVar12 = 0;
            while( true ) {
              prVar3 = local_98;
              i_00 = (long)&(p_Var17->super__Hash_node_base)._M_nxt + sVar12;
              iVar19 = (int)sVar12;
              if ((long)local_48 <= (long)i_00) break;
              piVar7 = ring_buffer<int>::rat(local_98,sVar12);
              iVar13 = *piVar7;
              piVar7 = ring_buffer<int>::rat(prVar3,i_00);
              if (iVar13 != *piVar7) {
                uVar5 = iVar19 - (int)local_70;
                goto LAB_0024977e;
              }
              sVar12 = sVar12 + 1;
            }
            uVar5 = (uint)local_88;
LAB_0024977e:
            if ((int)local_78 < iVar19) {
              iVar19 = (int)local_78;
            }
            (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[local_90 - (long)p_Var17] = iVar19;
            _Var10._M_cur = local_60._M_cur;
            if (sVar12 != 0) {
              _Var10._M_cur = p_Var17;
            }
            uVar15 = (ulong)_Var10._M_cur & 0xffffffff;
            uVar20 = uVar20 & 0xffffffff;
            uVar18 = local_78;
            uVar14 = local_68;
            if (sVar12 != 0) {
              uVar20 = (ulong)uVar5;
            }
          }
          else {
            piVar2 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar6 = piVar2[((int)local_88 - iVar13) + (int)uVar15];
            if (iVar19 - iVar13 < iVar6) {
              uVar18 = (ulong)(iVar19 + 1U);
              if ((int)(iVar19 + 1U) < (int)uVar14) {
                uVar18 = uVar14 & 0xffffffff;
              }
              do {
                uVar20 = i_01;
                prVar3 = local_98;
                iVar19 = (int)uVar18;
                i_01 = uVar20 + 1;
                if ((long)local_48 <= (long)i_01) goto LAB_00249736;
                piVar7 = ring_buffer<int>::rat(local_98,i_01);
                iVar19 = *piVar7;
                piVar7 = ring_buffer<int>::rat(prVar3,local_70 + uVar20);
              } while (iVar19 == *piVar7);
              iVar19 = (int)i_01;
LAB_00249736:
              iVar6 = iVar19 - iVar13;
              if ((int)local_78 < iVar19 - iVar13) {
                iVar6 = (int)local_78;
              }
              (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[local_90 - (long)p_Var17] = iVar6;
              uVar15 = (ulong)p_Var17 & 0xffffffff;
              uVar18 = local_78;
              uVar14 = local_68;
            }
            else {
              if ((int)uVar18 < iVar6) {
                iVar6 = (int)uVar18;
              }
              piVar2[local_90 - (long)p_Var17] = iVar6;
            }
          }
          p_Var17 = (__node_type *)((long)&(p_Var17->super__Hash_node_base)._M_nxt + 1);
          local_70 = local_70 + -1;
        }
        iVar19 = (int)uVar14 + -2;
        uVar14 = 0;
        uVar18 = local_88 & 0xffffffff;
        if ((int)local_88 < 1) {
          uVar18 = uVar14;
        }
        for (; uVar18 != uVar14; uVar14 = uVar14 + 1) {
          iVar13 = *(int *)(*(long *)(local_80 + 0x14) + uVar14 * 4);
          if ((int)local_80[3] <= iVar13) {
            piVar7 = ring_buffer<int>::rat(local_98,(long)iVar19);
            token = *piVar7;
            iVar8 = std::
                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(local_50,&token);
            if ((iVar8.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
                 (__node_type *)0x0) ||
               (*(int *)((long)iVar8.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                               _M_cur + 0xc) < iVar13)) {
              pmVar9 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_50,&token);
              *pmVar9 = iVar13;
            }
          }
          iVar19 = iVar19 + -1;
        }
        iVar19 = 0;
        if (1.000001 < (float)local_80[2]) {
          fVar21 = logf((float)local_80[2]);
          iVar19 = (int)(88.72284 / fVar21);
        }
        for (uVar18 = 0; uVar18 < plVar4->size; uVar18 = uVar18 + 1) {
          iVar8 = std::
                  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_50,&plVar4->data[uVar18].id);
          if (iVar8.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
              (__node_type *)0x0) {
            pVar23 = std::
                     _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                     ::equal_range(local_40,&plVar4->data[uVar18].id);
            for (_Var10._M_cur =
                      (__node_type *)
                      pVar23.first.
                      super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                      ._M_cur;
                (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                 )_Var10._M_cur !=
                pVar23.second.
                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                ; _Var10._M_cur = (__node_type *)((_Var10._M_cur)->super__Hash_node_base)._M_nxt) {
              if (*(long *)((long)&((_Var10._M_cur)->
                                   super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_storage._M_storage + 8) ==
                  *(long *)((long)&((_Var10._M_cur)->
                                   super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_storage._M_storage + 0x10)) goto LAB_002498fc;
            }
            iVar6 = *(int *)((long)iVar8.super__Node_iterator_base<std::pair<const_int,_int>,_false>
                                   ._M_cur + 0xc) - local_80[3];
            iVar13 = iVar19;
            if (iVar6 < iVar19) {
              iVar13 = iVar6;
            }
            if (iVar19 < 1) {
              iVar13 = iVar6;
            }
            local_98 = (ring_buffer<int> *)(double)(float)local_80[1];
            dVar22 = pow((double)(float)local_80[2],(double)iVar13);
            plVar4->data[uVar18].logit =
                 plVar4->data[uVar18].logit - (float)(dVar22 * (double)local_98);
          }
LAB_002498fc:
        }
        plVar4->sorted = false;
      }
    }
  }
  return;
}

Assistant:

static void llama_sampler_dry_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_dry *) smpl->ctx;

    if (ctx->dry_multiplier == 0.0f || ctx->dry_base < 1.0f || ctx->dry_penalty_last_n == 0) {
        return;
    }

    int32_t effective_dry_penalty_last_n = (ctx->dry_penalty_last_n == -1) ? ctx->total_context_size : std::max(ctx->dry_penalty_last_n, 0);
    int last_n_repeat = std::min(std::min((int)ctx->last_tokens.size(), effective_dry_penalty_last_n), ctx->total_context_size);

    if (last_n_repeat <= ctx->dry_allowed_length) {
        return;
    }

    ctx->dry_repeat_count.assign(last_n_repeat, 0);
    ctx->dry_max_token_repeat.clear();

    // Step 1: Look for restart sequences to limit the maximum repetition length.
    // Work backwards through the context looking for any token that begins a restart sequence.
    //
    // The collection `restart_sequences` is a mapping from a "head" token to all "tail"
    // sequences that together comprise a restart sequence. This allows us to quickly check
    // whether each token is the head of a complete sequence. Most restart sequences are actually
    // a single token, and for these the "tail" is an empty vector.
    //
    // If the token is a "head", test all restart sequences that begin with this token
    // (there will often only be one sequence for each token, but if sequences like 'aaaq1' and
    // 'aaa1' are used as restart strings, both could start with 'aaa' when tokenized). The
    // longest matching sequence (if any) is used to limit the maximum repetition length.
    //
    // Note that in the case case of a short sequence contained in a longer one, this might fail to
    // find the smallest value for `rep_limit`. For example, if 'amniotic' and 'ni' are both used as
    // restart sequences, 'ni' will be found first, and since it's shorter it will fail to suppress
    // 'otic'. This is a minor issue since fully contained restart sequences are likely to be rare.
    //
    // This is theoretically worst-case O(N^2) for arbitrary restart sequences, which is why we
    // have already clamped the maximum tail sequence length when generating `restart_sequences`.
    // With clamping, this scan is O(N) in the context length.

    int rep_limit = last_n_repeat;
    for (int i = 0; i < last_n_repeat; ++i) {
        llama_token token = ctx->last_tokens.rat(i);
        auto its = ctx->dry_processed_breakers.equal_range(token);
        if (its.first == ctx->dry_processed_breakers.end()) {
            continue;
        }
        int longest_match = -1;
        for (auto it = its.first; it != its.second; ++it) {
            // Note that (*it) does not contain the head character, so seq_len will be
            // the restart sequence length minus 1.
            // In the common case of a single-token restart sequence, (*it) will be empty
            // and we will trivially match.
            int seq_len = (int)it->second.size();
            if (seq_len > longest_match && seq_len <= (int)i) {
                bool match = true;
                for (int offset = 0; offset < seq_len; ++offset) {
                    // The -1 when indexing `last_tokens` is because we already matched the head.
                    if (it->second[offset] != ctx->last_tokens.rat(i - offset - 1)) {
                        match = false;
                        break;
                    }
                }
                if (match) {
                    longest_match = seq_len;
                }
            }
        }
        if (longest_match >= 0) {
            // We found a restart sequence starting `i` tokens from the end and continuing for
            // `longest_match` tokens.
            rep_limit = i - longest_match;
            break;
        }
    }
    if (rep_limit < ctx->dry_allowed_length) {
        return;
    }

    // Step 2: Iterate in reverse over the last N tokens of the context, using the "Z-algorithm" (in
    // the reverse direction) to efficiently compute the positions and lengths of suffixes appearing
    // elsewhere in the context. We limit the suffix length to `rep_limit` to respect restart sequences.
    //
    // This algorithm is not currently documented on Wikipedia, but there is a clear description here:
    // https://ivanyu.me/blog/2014/10/15/z-algorithm/
    //
    // The code below is adapted from the public domain implementation by the same author here:
    // https://github.com/ivanyu/string-algorithms/blob/master/z_algorithm.py
    //
    // Example:
    // Last N tokens: a b c c b c y a b c
    // Repeat counts: 0 0 3 1 0 2 0 0 0 0
    //                    ^
    //   This `3` means that the last three tokens of the context (a b c) also appear here.
    //
    // This step is worst case O(N) since the Z-algorithm is linear, despite the appearance of nested
    // for/while loops. This can be seen by observing that the `lt` and `rt` bounds are set after each
    // repeated suffix is detected (i.e. after each while loop when n > 0). These bound variables
    // ensure that the inner while loops only examine each token in the context once as the outer
    // for loop iterates over the context.

    {
        const int last = last_n_repeat - 1;
        int rt = 0, lt = 0;

        for (int k = 1; k < last_n_repeat; ++k) {
            if (k > rt) {
                // If k is outside the current Z-box, do naive computation.
                int n = 0;
                while (n + k < last_n_repeat && ctx->last_tokens.rat(n) == ctx->last_tokens.rat(n+k)) {
                    ++n;
                }
                ctx->dry_repeat_count[last - k] = std::min(n, rep_limit);
                if (n > 0) {
                    lt = k;
                    rt = k + n - 1;
                }
            } else {
                // If k is inside the current Z-box, consider two cases.

                int p = k - lt; // Pair index.
                int right_part_len = rt - k + 1;

                if (ctx->dry_repeat_count[last - p] < right_part_len) {
                    int n = std::min(ctx->dry_repeat_count[last - p], rep_limit);
                    ctx->dry_repeat_count[last - k] = n;
                } else {
                    int i = rt + 1;
                    while (i < last_n_repeat && ctx->last_tokens.rat(i) == ctx->last_tokens.rat(i - k)) {
                        i += 1;
                    }

                    int n = std::min(i - k, rep_limit);
                    ctx->dry_repeat_count[last - k] = n;
                    lt = k;
                    rt = i - 1;
                }
            }
        }
    }

    // Step 3: Iterate over dry_repeat_count and last_tokens, examining the maximum repeat length
    // that would be generated by emitting each new token that would extend a sequence.
    //
    // Following the same example as above:
    // Last N tokens: a b c c b c y a b c
    // Repeat counts: 0 0 3 1 0 2 0 0 0 0
    //
    // For each non-zero, look ahead one token. This token, if emitted, would extend the repetition.
    // c: 3 -> 4 (from `a b c` to `a b c c`)
    // b: 1 -> 2 (from `c` to `c b`)
    // y: 2 -> 3 (from `b c` to `b c y`)

    for (int i = 0; i < last_n_repeat - 1; ++i) {
        int repeat_len = ctx->dry_repeat_count[i];
        if (repeat_len >= ctx->dry_allowed_length) {
            // This token ends a repeat, so the next token would continue one.
            // By convention, the value of `repeat_len` only includes the tokens currently
            // in the context, not the new token that would be added.
            llama_token token = ctx->last_tokens.rat(last_n_repeat - 2 - i);
            // Track the maximum sequence ending in this token.
            const auto& it = ctx->dry_max_token_repeat.find(token);
            if (it == ctx->dry_max_token_repeat.end() || it->second < repeat_len) {
                ctx->dry_max_token_repeat[token] = repeat_len;
            }
        }
    }

    // Step 4: Apply logit penalties based on the maximum repeat length for relevant tokens.

    // Prevent floating point overflow in `pow(penalty_base, exponent)` by clamping to `max_exponent`.
    // Compute it from `penalty_base` and the approximate log of `std::numeric_limits<float>::max()`
    const float FLOAT_MAX_LOG = 88.7228391f;
    int max_exponent = 0;
    if (ctx->dry_base > 1.000001f) {
        max_exponent = FLOAT_MAX_LOG / std::log(ctx->dry_base);
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        const auto& af_kvp = ctx->dry_max_token_repeat.find(cur_p->data[i].id);
        if (af_kvp != ctx->dry_max_token_repeat.end()) {
            // Check all sequence breakers starting with this token
            auto range = ctx->dry_processed_breakers.equal_range(cur_p->data[i].id);
            bool is_single_token_breaker = false;

            for (auto it = range.first; it != range.second; ++it) {
                if (it->second.empty()) {
                    is_single_token_breaker = true;
                    break;
                }
            }

            // Apply penalty only if it's not a single-token sequence breaker
            if (!is_single_token_breaker) {
                int repeat_exp = af_kvp->second - ctx->dry_allowed_length;
                if (max_exponent > 0 && repeat_exp > max_exponent) {
                    repeat_exp = max_exponent;
                }
                float penalty = ctx->dry_multiplier * std::pow(ctx->dry_base, repeat_exp);
                cur_p->data[i].logit -= penalty;
            }
        }
    }

    cur_p->sorted = false;
}